

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

int32_t unistrTextExtract(UText *t,int64_t start,int64_t limit,UChar *dest,int32_t destCapacity,
                         UErrorCode *pErrorCode)

{
  short sVar1;
  UnicodeString *this;
  int length;
  int start_00;
  int32_t iVar2;
  int32_t length_00;
  
  this = (UnicodeString *)t->context;
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  length_00 = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((destCapacity < 0) || (destCapacity != 0 && dest == (UChar *)0x0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    if (start < 0 || limit < start) {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      length_00 = 0;
    }
    else {
      start_00 = iVar2;
      if (start < iVar2) {
        start_00 = icu_63::UnicodeString::getChar32Start(this,(int32_t)start);
      }
      if (limit < iVar2) {
        iVar2 = icu_63::UnicodeString::getChar32Start(this,(int32_t)limit);
      }
      length_00 = iVar2 - start_00;
      if (dest != (UChar *)0x0 && 0 < destCapacity) {
        length = destCapacity;
        if (length_00 < destCapacity) {
          length = length_00;
        }
        icu_63::UnicodeString::doExtract(this,start_00,length,dest,0);
        start_00 = start_00 + length;
      }
      t->chunkOffset = start_00;
      u_terminateUChars_63(dest,destCapacity,length_00,pErrorCode);
    }
  }
  return length_00;
}

Assistant:

static int32_t U_CALLCONV
unistrTextExtract(UText *t,
                  int64_t start, int64_t limit,
                  UChar *dest, int32_t destCapacity,
                  UErrorCode *pErrorCode) {
    const UnicodeString *us=(const UnicodeString *)t->context;
    int32_t length=us->length();

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
    }
    if(start<0 || start>limit) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    int32_t start32 = start<length ? us->getChar32Start((int32_t)start) : length;
    int32_t limit32 = limit<length ? us->getChar32Start((int32_t)limit) : length;

    length=limit32-start32;
    if (destCapacity>0 && dest!=NULL) {
        int32_t trimmedLength = length;
        if(trimmedLength>destCapacity) {
            trimmedLength=destCapacity;
        }
        us->extract(start32, trimmedLength, dest);
        t->chunkOffset = start32+trimmedLength;
    } else {
        t->chunkOffset = start32;
    }
    u_terminateUChars(dest, destCapacity, length, pErrorCode);
    return length;
}